

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int UTF8ToUTF16LE(uchar *outb,int *outlen,uchar *in,int *inlen)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  int *piVar8;
  unsigned_short tmp2;
  unsigned_short tmp1;
  uchar *tmp;
  int trailing;
  uint d;
  uint c;
  uchar *inend;
  unsigned_short *outend;
  unsigned_short *outstart;
  uchar *instart;
  uchar *processed;
  unsigned_short *out;
  int *inlen_local;
  uchar *in_local;
  int *outlen_local;
  uchar *outb_local;
  
  if (((outb == (uchar *)0x0) || (outlen == (int *)0x0)) || (inlen == (int *)0x0)) {
    outb_local._4_4_ = -1;
  }
  else if (in == (uchar *)0x0) {
    *outlen = 0;
    *inlen = 0;
    outb_local._4_4_ = 0;
  }
  else {
    piVar7 = (int *)(in + *inlen);
    iVar1 = *outlen;
    processed = outb;
    inlen_local = (int *)in;
    while( true ) {
      iVar2 = (int)inlen_local;
      iVar3 = (int)in;
      if (piVar7 <= inlen_local) break;
      piVar8 = (int *)((long)inlen_local + 1);
      trailing = (int)(byte)*inlen_local;
      if ((uint)trailing < 0x80) {
        tmp._4_4_ = 0;
      }
      else {
        if ((uint)trailing < 0xc0) {
          *outlen = (int)(((long)processed - (long)outb >> 1) << 1);
          *inlen = iVar2 - iVar3;
          return -2;
        }
        if ((uint)trailing < 0xe0) {
          trailing = trailing & 0x1f;
          tmp._4_4_ = 1;
        }
        else if ((uint)trailing < 0xf0) {
          trailing = trailing & 0xf;
          tmp._4_4_ = 2;
        }
        else {
          if (0xf7 < (uint)trailing) {
            *outlen = (int)(((long)processed - (long)outb >> 1) << 1);
            *inlen = iVar2 - iVar3;
            return -2;
          }
          trailing = trailing & 7;
          tmp._4_4_ = 3;
        }
      }
      inlen_local = piVar8;
      if ((long)piVar7 - (long)piVar8 < (long)tmp._4_4_) break;
      while ((tmp._4_4_ != 0 && (inlen_local < piVar7))) {
        piVar8 = (int *)((long)inlen_local + 1);
        iVar5 = *inlen_local;
        inlen_local = piVar8;
        if (((byte)iVar5 & 0xc0) != 0x80) break;
        trailing = (byte)iVar5 & 0x3f | trailing << 6;
        tmp._4_4_ = tmp._4_4_ + -1;
      }
      if ((uint)trailing < 0x10000) {
        if (outb + (long)(iVar1 / 2) * 2 <= processed) break;
        if (xmlLittleEndian == 0) {
          *processed = (uchar)trailing;
          processed[1] = (uchar)((uint)trailing >> 8);
        }
        else {
          *(short *)processed = (short)trailing;
        }
        processed = processed + 2;
      }
      else {
        if ((0x10ffff < (uint)trailing) || (outb + (long)(iVar1 / 2) * 2 <= processed + 2)) break;
        uVar6 = trailing - 0x10000;
        if (xmlLittleEndian == 0) {
          *processed = (uchar)(uVar6 >> 10);
          processed[1] = (byte)((uVar6 >> 10) >> 8) | 0xd8;
          uVar4 = (ushort)uVar6 & 0x3ff;
          processed[2] = (uchar)uVar4;
          processed[3] = (byte)(uVar4 >> 8) | 0xdc;
        }
        else {
          *(ushort *)processed = (ushort)(uVar6 >> 10) | 0xd800;
          *(ushort *)(processed + 2) = (ushort)uVar6 & 0x3ff | 0xdc00;
        }
        processed = processed + 4;
      }
    }
    *outlen = (int)(((long)processed - (long)outb >> 1) << 1);
    *inlen = iVar2 - iVar3;
    outb_local._4_4_ = *outlen;
  }
  return outb_local._4_4_;
}

Assistant:

static int
UTF8ToUTF16LE(unsigned char* outb, int *outlen,
            const unsigned char* in, int *inlen)
{
    unsigned short* out = (unsigned short*) outb;
    const unsigned char* processed = in;
    const unsigned char *const instart = in;
    unsigned short* outstart= out;
    unsigned short* outend;
    const unsigned char* inend;
    unsigned int c, d;
    int trailing;
    unsigned char *tmp;
    unsigned short tmp1, tmp2;

    /* UTF16LE encoding has no BOM */
    if ((out == NULL) || (outlen == NULL) || (inlen == NULL)) return(-1);
    if (in == NULL) {
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend= in + *inlen;
    outend = out + (*outlen / 2);
    while (in < inend) {
      d= *in++;
      if      (d < 0x80)  { c= d; trailing= 0; }
      else if (d < 0xC0) {
          /* trailing byte in leading position */
	  *outlen = (out - outstart) * 2;
	  *inlen = processed - instart;
	  return(-2);
      } else if (d < 0xE0)  { c= d & 0x1F; trailing= 1; }
      else if (d < 0xF0)  { c= d & 0x0F; trailing= 2; }
      else if (d < 0xF8)  { c= d & 0x07; trailing= 3; }
      else {
	/* no chance for this in UTF-16 */
	*outlen = (out - outstart) * 2;
	*inlen = processed - instart;
	return(-2);
      }

      if (inend - in < trailing) {
          break;
      }

      for ( ; trailing; trailing--) {
          if ((in >= inend) || (((d= *in++) & 0xC0) != 0x80))
	      break;
          c <<= 6;
          c |= d & 0x3F;
      }

      /* assertion: c is a single UTF-4 value */
        if (c < 0x10000) {
            if (out >= outend)
	        break;
	    if (xmlLittleEndian) {
		*out++ = c;
	    } else {
		tmp = (unsigned char *) out;
		*tmp = c ;
		*(tmp + 1) = c >> 8 ;
		out++;
	    }
        }
        else if (c < 0x110000) {
            if (out+1 >= outend)
	        break;
            c -= 0x10000;
	    if (xmlLittleEndian) {
		*out++ = 0xD800 | (c >> 10);
		*out++ = 0xDC00 | (c & 0x03FF);
	    } else {
		tmp1 = 0xD800 | (c >> 10);
		tmp = (unsigned char *) out;
		*tmp = (unsigned char) tmp1;
		*(tmp + 1) = tmp1 >> 8;
		out++;

		tmp2 = 0xDC00 | (c & 0x03FF);
		tmp = (unsigned char *) out;
		*tmp  = (unsigned char) tmp2;
		*(tmp + 1) = tmp2 >> 8;
		out++;
	    }
        }
        else
	    break;
	processed = in;
    }
    *outlen = (out - outstart) * 2;
    *inlen = processed - instart;
    return(*outlen);
}